

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O3

BasePropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
 __thiscall
OpenMesh::PropertyContainer::
add<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
          (PropertyContainer *this,
          HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>
          *param_1,string *_name)

{
  iterator __position;
  pointer pcVar1;
  BaseProperty *in_RAX;
  BaseProperty **ppBVar2;
  undefined8 *puVar3;
  BaseHandle BVar4;
  BaseProperty *local_28;
  
  ppBVar2 = *(BaseProperty ***)(this + 8);
  __position._M_current = *(BaseProperty ***)(this + 0x10);
  BVar4.idx_ = 0;
  if (ppBVar2 == __position._M_current) {
LAB_001339cc:
    local_28 = in_RAX;
    if (ppBVar2 != __position._M_current) goto LAB_001339f8;
  }
  else {
    do {
      if (*ppBVar2 == (BaseProperty *)0x0) goto LAB_001339cc;
      ppBVar2 = ppBVar2 + 1;
      BVar4.idx_ = BVar4.idx_ + 1;
    } while (ppBVar2 != __position._M_current);
  }
  local_28 = (BaseProperty *)0x0;
  if (__position._M_current == *(BaseProperty ***)(this + 0x18)) {
    std::vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>>::
    _M_realloc_insert<OpenMesh::BaseProperty*>
              ((vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>> *)(this + 8)
               ,__position,&local_28);
  }
  else {
    *__position._M_current = (BaseProperty *)0x0;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 8;
  }
LAB_001339f8:
  puVar3 = (undefined8 *)operator_new(0x48);
  *puVar3 = &DAT_001b2cc0;
  puVar3[1] = puVar3 + 3;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar3 + 1),pcVar1,pcVar1 + _name->_M_string_length);
  *(undefined1 *)(puVar3 + 5) = 0;
  *puVar3 = &PTR__PropertyT_001b1510;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  *(undefined8 **)(*(long *)(this + 8) + (ulong)(uint)BVar4.idx_ * 8) = puVar3;
  return (BaseHandle)(BaseHandle)BVar4.idx_;
}

Assistant:

BasePropHandleT<T> add(const T&, const std::string& _name="<unknown>")
  {
    Properties::iterator p_it=properties_.begin(), p_end=properties_.end();
    int idx=0;
    for ( ; p_it!=p_end && *p_it!=NULL; ++p_it, ++idx ) {};
    if (p_it==p_end) properties_.push_back(NULL);
    properties_[idx] = new PropertyT<T>(_name);
    return BasePropHandleT<T>(idx);
  }